

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unlzexe.cc
# Opt level: O0

void build_rellocs_90(input *file,
                     vector<explode::rellocation,_std::allocator<explode::rellocation>_> *rellocs)

{
  undefined8 this;
  rellocation local_36;
  uint16_t local_32;
  uint local_30;
  uint16_t local_2c;
  uint16_t offs;
  int c;
  uint16_t t;
  int16_t seg;
  byte_reader f;
  vector<explode::rellocation,_std::allocator<explode::rellocation>_> *rellocs_local;
  input *file_local;
  
  f._8_8_ = rellocs;
  explode::byte_reader::byte_reader((byte_reader *)&c,file);
  offs = 0;
  do {
    local_2c = explode::byte_reader::word((byte_reader *)&c);
    for (local_30 = (uint)local_2c; 0 < (int)local_30; local_30 = local_30 - 1) {
      local_32 = explode::byte_reader::word((byte_reader *)&c);
      this = f._8_8_;
      explode::rellocation::rellocation(&local_36,offs,local_32);
      std::vector<explode::rellocation,_std::allocator<explode::rellocation>_>::push_back
                ((vector<explode::rellocation,_std::allocator<explode::rellocation>_> *)this,
                 &local_36);
    }
    offs = offs + 0x1000;
  } while (offs != 0);
  return;
}

Assistant:

static void build_rellocs_90 (explode::input& file, std::vector <explode::rellocation>& rellocs)
{
	explode::byte_reader f(file);
  int16_t seg = 0;
  do
    {
	  uint16_t t = f.word();
      int c = t & 0xFFFF;

      for (; c>0; c--)
	{
	  uint16_t offs = f.word ();
	  rellocs.push_back (explode::rellocation (static_cast <uint16_t> (seg), offs));
	}
      seg = static_cast <int16_t> (seg + 0x1000);
    } // while (seg != static_cast <int16_t>(0xF000+0x1000));
  while (seg);
  //std::cout << "seg = " << std::hex << seg << std::endl;
}